

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O0

ostream * tchecker::refdbm::output(ostream *os,db_t *rdbm,reference_clock_variables_t *r)

{
  db_t dVar1;
  bool bVar2;
  bool bVar3;
  db_t dVar4;
  integer_t iVar5;
  size_t sVar6;
  string *psVar7;
  ostream *poVar8;
  db_t *db;
  undefined1 auVar9 [16];
  string local_90;
  string local_60;
  integer_t local_40;
  db_t local_3c;
  integer_t vij;
  db_t local_34;
  db_t cji;
  db_t cij;
  clock_id_t j;
  clock_id_t i;
  bool first;
  clock_id_t rdim;
  reference_clock_variables_t *r_local;
  db_t *rdbm_local;
  ostream *os_local;
  
  sVar6 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)r);
  dVar4 = SUB84(sVar6,0);
  bVar2 = true;
  std::operator<<(os,"(");
  for (cij = (db_t)0x0; dVar1 = cij, (uint)cij < (uint)dVar4; cij = (db_t)((int)cij + 1)) {
    while (cji = (db_t)((int)dVar1 + 1), (uint)cji < (uint)dVar4) {
      local_34 = rdbm[(uint)((int)cij * (int)dVar4 + (int)cji)];
      vij = *(integer_t *)(rdbm + (uint)((int)cji * (int)dVar4 + (int)cij));
      local_3c = tchecker::dbm::sum(&local_34,(db_t *)&vij);
      bVar3 = tchecker::dbm::operator==(&local_3c,(db_t *)&tchecker::dbm::LE_ZERO);
      if (bVar3) {
        if (!bVar2) {
          std::operator<<(os," & ");
        }
        bVar2 = false;
        psVar7 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)r,(uint)cij);
        poVar8 = std::operator<<(os,(string *)psVar7);
        poVar8 = std::operator<<(poVar8,"=");
        psVar7 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)r,(uint)cji);
        std::operator<<(poVar8,(string *)psVar7);
        local_40 = tchecker::dbm::value(&local_34);
        if (local_40 < 1) {
          dVar1 = cji;
          if (local_40 < 0) {
            poVar8 = std::operator<<(os,"-");
            iVar5 = tchecker::dbm::value(&local_34);
            std::ostream::operator<<(poVar8,-iVar5);
            dVar1 = cji;
          }
        }
        else {
          poVar8 = std::operator<<(os,"+");
          iVar5 = tchecker::dbm::value(&local_34);
          std::ostream::operator<<(poVar8,iVar5);
          dVar1 = cji;
        }
      }
      else {
        bVar3 = tchecker::dbm::operator!=(&local_34,(db_t *)&tchecker::dbm::LT_INFINITY);
        if ((bVar3) ||
           (bVar3 = tchecker::dbm::operator!=((db_t *)&vij,(db_t *)&tchecker::dbm::LT_INFINITY),
           dVar1 = cji, bVar3)) {
          if (!bVar2) {
            std::operator<<(os," & ");
          }
          bVar2 = false;
          bVar3 = tchecker::dbm::operator!=((db_t *)&vij,(db_t *)&tchecker::dbm::LT_INFINITY);
          if (bVar3) {
            iVar5 = tchecker::dbm::value((db_t *)&vij);
            auVar9 = std::ostream::operator<<(os,-iVar5);
            tchecker::dbm::comparator_str_abi_cxx11_(&local_60,(dbm *)&vij,auVar9._8_8_);
            std::operator<<(auVar9._0_8_,(string *)&local_60);
            std::__cxx11::string::~string((string *)&local_60);
          }
          psVar7 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)r,(uint)cij);
          poVar8 = std::operator<<(os,(string *)psVar7);
          poVar8 = std::operator<<(poVar8,"-");
          psVar7 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::name((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)r,(uint)cji);
          std::operator<<(poVar8,(string *)psVar7);
          bVar3 = tchecker::dbm::operator!=(&local_34,(db_t *)&tchecker::dbm::LT_INFINITY);
          dVar1 = cji;
          if (bVar3) {
            tchecker::dbm::comparator_str_abi_cxx11_(&local_90,(dbm *)&local_34,db);
            poVar8 = std::operator<<(os,(string *)&local_90);
            iVar5 = tchecker::dbm::value(&local_34);
            std::ostream::operator<<(poVar8,iVar5);
            std::__cxx11::string::~string((string *)&local_90);
            dVar1 = cji;
          }
        }
      }
    }
  }
  std::operator<<(os,")");
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::dbm::db_t const * rdbm, tchecker::reference_clock_variables_t const & r)
{
  tchecker::clock_id_t const rdim = r.size();
  bool first = true;

  os << "(";

  for (tchecker::clock_id_t i = 0; i < rdim; ++i) {
    for (tchecker::clock_id_t j = i + 1; j < rdim; ++j) {
      tchecker::dbm::db_t cij = RDBM(i, j), cji = RDBM(j, i);
      // vi == vj + k
      if (tchecker::dbm::sum(cij, cji) == tchecker::dbm::LE_ZERO) {
        if (!first)
          os << " & ";
        first = false;

        os << r.name(i) << "=" << r.name(j);
        tchecker::integer_t vij = tchecker::dbm::value(cij);
        if (vij > 0)
          os << "+" << tchecker::dbm::value(cij);
        else if (vij < 0)
          os << "-" << -tchecker::dbm::value(cij);
      }
      // k1 <= xi - xj <= k2
      else if ((cij != tchecker::dbm::LT_INFINITY) || (cji != tchecker::dbm::LT_INFINITY)) {
        if (!first)
          os << " & ";
        first = false;

        if (cji != tchecker::dbm::LT_INFINITY)
          os << -tchecker::dbm::value(cji) << tchecker::dbm::comparator_str(cji);

        os << r.name(i) << "-" << r.name(j);

        if (cij != tchecker::dbm::LT_INFINITY)
          os << tchecker::dbm::comparator_str(cij) << tchecker::dbm::value(cij);
      }
    }
  }

  os << ")";

  return os;
}